

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O2

String * __thiscall
Diligent::BasicFile::GetOpenModeStr_abi_cxx11_(String *__return_storage_ptr__,BasicFile *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch((this->m_OpenAttribs).AccessMode) {
  case Read:
    break;
  case Overwrite:
    break;
  case Append:
    break;
  case ReadUpdate:
    goto LAB_0047696c;
  case OverwriteUpdate:
    goto LAB_0047696c;
  case AppendUpdate:
LAB_0047696c:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  default:
    goto switchD_0047693a_default;
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
switchD_0047693a_default:
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

String BasicFile::GetOpenModeStr()
{
    std::string OpenModeStr;
    switch (m_OpenAttribs.AccessMode)
    {
        // clang-format off
        case EFileAccessMode::Read:            OpenModeStr += 'r'; break;
        case EFileAccessMode::Overwrite:       OpenModeStr += 'w'; break;
        case EFileAccessMode::Append:          OpenModeStr += 'a'; break;
        case EFileAccessMode::ReadUpdate:      OpenModeStr += "r+"; break;
        case EFileAccessMode::OverwriteUpdate: OpenModeStr += "w+"; break;
        case EFileAccessMode::AppendUpdate:    OpenModeStr += "a+"; break;
        // clang-format on
        default: break;
    }

    // Always open file in binary mode. Text mode is platform-specific
    OpenModeStr += 'b';

    return OpenModeStr;
}